

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_mat.h
# Opt level: O3

bool __thiscall
dlib::
matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>,false>,dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,true>>
::
aliases<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>
          (matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>,_false>,_dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>_>
           *this,matrix_exp<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
                 *item)

{
  float *pfVar1;
  bool bVar2;
  
  if (*(long *)(item + 0x10) != 0 && *(long *)(item + 8) != 0) {
    pfVar1 = *(float **)item;
    bVar2 = true;
    if (((((((this->lhs->m).lhs)->op).m)->op).ptr != pfVar1) &&
       ((((this->lhs->m).rhs)->op).ptr != pfVar1)) {
      bVar2 = (this->rhs->m->op).ptr == pfVar1;
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool aliases (
            const matrix_exp<matrix<T,num_rows,num_cols, mem_manager,layout> >& item
        ) const 
        { 
            if (item.size() == 0)
                return false;
            else
                return (ptr == &item(0,0)); 
        }